

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::moveCom(Molecule *this,Vector3d *delta)

{
  pointer ppSVar1;
  StuntDouble *this_00;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  ppSVar1 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 !=
      (this->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001d3e57;
  this_00 = (StuntDouble *)0x0;
  do {
    do {
      if (this_00 == (StuntDouble *)0x0) {
        return;
      }
      StuntDouble::getPos((Vector3d *)&local_78,this_00);
      OpenMD::operator+(&local_60,&local_78,&delta->super_Vector<double,_3U>);
      Vector<double,_3U>::Vector(&local_48,&local_60);
      StuntDouble::setPos(this_00,(Vector3d *)&local_48);
      ppSVar1 = ppSVar1 + 1;
      this_00 = (StuntDouble *)0x0;
    } while (ppSVar1 ==
             (this->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
LAB_001d3e57:
    this_00 = *ppSVar1;
  } while( true );
}

Assistant:

void Molecule::moveCom(const Vector3d& delta) {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      sd->setPos(sd->getPos() + delta);
    }
  }